

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O3

void __thiscall
duckdb::Linenoise::NextPosition
          (Linenoise *this,char *buf,size_t len,size_t *cpos,int *rows,int *cols,int plen)

{
  ulong uVar1;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  int sz;
  int local_34;
  size_t sVar5;
  
  sVar5 = *cpos;
  if ((buf[sVar5] == '\r') || (buf[sVar5] == '\n')) {
    *rows = *rows + 1;
    *cols = plen;
    uVar1 = sVar5 + 1;
    *cpos = uVar1;
    if (((uVar1 < len) && (buf[sVar5] == '\r')) && (buf[uVar1] == '\n')) {
      *cpos = sVar5 + 2;
    }
  }
  else {
    iVar2 = Utf8Proc::UTF8ToCodepoint(buf + sVar5,&local_34);
    if (iVar2 < 0) {
      sVar5 = *cpos + 1;
      iVar3 = 1;
    }
    else {
      sVar5 = Utf8Proc::RenderWidth(buf,len,*cpos);
      iVar3 = (int)sVar5;
      sVar5 = Utf8Proc::NextGraphemeCluster(buf,len,*cpos);
    }
    *cpos = sVar5;
    iVar4 = *cols + iVar3;
    if ((this->ws).ws_col < iVar4) {
      *rows = *rows + 1;
      iVar4 = iVar3 * 2;
    }
    *cols = iVar4;
  }
  return;
}

Assistant:

void Linenoise::NextPosition(const char *buf, size_t len, size_t &cpos, int &rows, int &cols, int plen) const {
	if (IsNewline(buf[cpos])) {
		// explicit newline! move to next line and insert a prompt
		rows++;
		cols = plen;
		cpos++;
		if (buf[cpos - 1] == '\r' && cpos < len && buf[cpos] == '\n') {
			cpos++;
		}
		return;
	}
	int sz;
	int char_render_width;
	if (duckdb::Utf8Proc::UTF8ToCodepoint(buf + cpos, sz) < 0) {
		char_render_width = 1;
		cpos++;
	} else {
		char_render_width = (int)duckdb::Utf8Proc::RenderWidth(buf, len, cpos);
		cpos = duckdb::Utf8Proc::NextGraphemeCluster(buf, len, cpos);
	}
	if (cols + char_render_width > ws.ws_col) {
		// exceeded l->cols, move to next row
		rows++;
		cols = char_render_width;
	}
	cols += char_render_width;
}